

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

int __thiscall CMU462::Viewer::init(Viewer *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLenum GVar2;
  ostream *poVar3;
  void *pvVar4;
  char *title_00;
  OSDText *pOVar5;
  Color local_d4;
  allocator<char> local_c1;
  string local_c0;
  Color local_9c;
  allocator<char> local_89;
  string local_88;
  byte local_66;
  allocator<char> local_65 [20];
  byte local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string title;
  Viewer *this_local;
  
  title.field_2._8_8_ = this;
  glfwSetErrorCallback(err_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar3 = std::operator<<(poVar3,"[CMU462] ");
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"Error: could not initialize GLFW!");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    exit(1);
  }
  local_51 = 0;
  local_66 = 0;
  if (renderer == (Renderer *)0x0) {
    std::allocator<char>::allocator();
    local_66 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"CMU462",local_65);
  }
  else {
    (*renderer->_vptr_Renderer[5])();
    local_51 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   "CMU462: ",&local_50);
  }
  if ((local_66 & 1) != 0) {
    std::allocator<char>::~allocator(local_65);
  }
  if ((local_51 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  title_00 = (char *)std::__cxx11::string::c_str();
  window = glfwCreateWindow(0x3c0,0x280,title_00,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar3 = std::operator<<(poVar3,"[CMU462] ");
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"Error: could not create window!");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(window);
  glfwSwapInterval(1);
  glfwSetFramebufferSizeCallback(window,resize_callback);
  glfwSetKeyCallback(window,key_callback);
  glfwSetCharCallback(window,char_callback);
  glfwSetCursorPosCallback(window,cursor_callback);
  glfwSetScrollCallback(window,scroll_callback);
  glfwSetInputMode(window,0x33003,1);
  glfwSetMouseButtonCallback(window,mouse_button_callback);
  GVar2 = glewInit();
  if (GVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar3 = std::operator<<(poVar3,"[CMU462] ");
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"Error: could not initialize GLEW!");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    glfwTerminate();
    exit(1);
  }
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glfwGetFramebufferSize(window,&buffer_w,&buffer_h);
  if (0x3c0 < CONCAT44(uRam0000000000446024,buffer_w)) {
    HDPI = 1;
  }
  if (renderer != (Renderer *)0x0) {
    if ((HDPI & 1) != 0) {
      Renderer::use_hdpi_reneder_target(renderer);
    }
    (*renderer->_vptr_Renderer[2])();
  }
  pOVar5 = (OSDText *)operator_new(0x60);
  OSDText::OSDText(pOVar5);
  osd_text = pOVar5;
  iVar1 = OSDText::init(pOVar5,(EVP_PKEY_CTX *)(ulong)(HDPI & 1));
  pOVar5 = osd_text;
  if (-1 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Renderer",&local_89);
    Color::Color(&local_9c,0.15,0.5,0.15,1.0);
    line_id_renderer = OSDText::add_line(pOVar5,-0.95,0.9,&local_88,0x12,local_9c);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    pOVar5 = osd_text;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Framerate",&local_c1);
    Color::Color(&local_d4,0.15,0.5,0.15,1.0);
    line_id_framerate = OSDText::add_line(pOVar5,-0.98,-0.96,&local_c0,0xe,local_d4);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    resize_callback(window,buffer_w,buffer_h);
    iVar1 = std::__cxx11::string::~string((string *)local_30);
    return iVar1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
  poVar3 = std::operator<<(poVar3,"[CMU462] ");
  poVar3 = std::operator<<(poVar3,"\x1b[0m");
  poVar3 = std::operator<<(poVar3,"Error: could not initialize on-screen display!");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void Viewer::init() {

  // initialize glfw
  glfwSetErrorCallback( err_callback );
  if( !glfwInit() ) {
    out_err("Error: could not initialize GLFW!");
    exit( 1 );
  }

  // create window
  string title = renderer ? "CMU462: " + renderer->name() : "CMU462";
  window = glfwCreateWindow( DEFAULT_W, DEFAULT_H, title.c_str(), NULL, NULL );
  if (!window) {
    out_err("Error: could not create window!");
    glfwTerminate();
    exit( 1 );
  }

  // set context
  glfwMakeContextCurrent( window );
  glfwSwapInterval(1);

  // framebuffer event callbacks
  glfwSetFramebufferSizeCallback( window, resize_callback );
  
  // key event callbacks
  glfwSetKeyCallback( window, key_callback );

  // character event callbacks
  glfwSetCharCallback( window, char_callback );
  
  // cursor event callbacks
  glfwSetCursorPosCallback( window, cursor_callback );

  // wheel event callbacks
  glfwSetScrollCallback(window, scroll_callback);  
  
  // mouse button callbacks
  glfwSetInputMode(window, GLFW_STICKY_MOUSE_BUTTONS, 1);
  glfwSetMouseButtonCallback(window, mouse_button_callback);

  // initialize glew
  if (glewInit() != GLEW_OK) {
    out_err("Error: could not initialize GLEW!");
    glfwTerminate();
    exit( 1 );
  }

  // enable alpha blending
  glEnable(GL_BLEND);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

  // resize components to current window size, get DPI
  glfwGetFramebufferSize(window, (int*) &buffer_w, (int*) &buffer_h );
  if( buffer_w > DEFAULT_W ) HDPI = true;

  // initialize renderer if already set
  if (renderer){
    if (HDPI) renderer->use_hdpi_reneder_target();
    renderer->init();
  } 

  // initialize status OSD
  osd_text = new OSDText();
  if (osd_text->init(HDPI) < 0) {
    out_err("Error: could not initialize on-screen display!");
    exit( 1 );
  }
  
  // add lines for renderer and fps
  line_id_renderer  = osd_text->add_line(-0.95,  0.90, "Renderer", 
                                          18, Color(0.15, 0.5, 0.15));
  line_id_framerate = osd_text->add_line(-0.98, -0.96, "Framerate", 
                                          14, Color(0.15, 0.5, 0.15));

  // resize elements to current size
  resize_callback(window, buffer_w, buffer_h);

}